

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O3

Vec_Vec_t * Saig_ManCexMinComputeReason(Aig_Man_t *pAig,Abc_Cex_t *pCex,int fPiReason)

{
  int iVar1;
  void **ppvVar2;
  void *pvVar3;
  Vec_Vec_t *vFrameCis;
  Vec_Vec_t *vFramePPs;
  Vec_Vec_t *pVVar4;
  long lVar5;
  
  if (pCex->nPis != pAig->nTruePis) {
    __assert_fail("pCex->nPis == Saig_ManPiNum(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin1.c"
                  ,0x1d4,"Vec_Vec_t *Saig_ManCexMinComputeReason(Aig_Man_t *, Abc_Cex_t *, int)");
  }
  if (pCex->nRegs != pAig->nRegs) {
    __assert_fail("pCex->nRegs == Saig_ManRegNum(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin1.c"
                  ,0x1d5,"Vec_Vec_t *Saig_ManCexMinComputeReason(Aig_Man_t *, Abc_Cex_t *, int)");
  }
  if ((pCex->iPo < 0) || (pAig->nTruePos <= pCex->iPo)) {
    __assert_fail("pCex->iPo >= 0 && pCex->iPo < Saig_ManPoNum(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin1.c"
                  ,0x1d6,"Vec_Vec_t *Saig_ManCexMinComputeReason(Aig_Man_t *, Abc_Cex_t *, int)");
  }
  vFrameCis = Saig_ManCexMinCollectFrameTerms(pAig,pCex);
  vFramePPs = Saig_ManCexMinCollectPhasePriority(pAig,pCex,vFrameCis);
  pVVar4 = Saig_ManCexMinCollectReason(pAig,pCex,vFrameCis,vFramePPs,fPiReason);
  iVar1 = vFramePPs->nSize;
  ppvVar2 = vFramePPs->pArray;
  if ((long)iVar1 < 1) {
    if (ppvVar2 != (void **)0x0) goto LAB_0058152f;
  }
  else {
    lVar5 = 0;
    do {
      pvVar3 = ppvVar2[lVar5];
      if (pvVar3 != (void *)0x0) {
        if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar3 + 8));
        }
        free(pvVar3);
      }
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
LAB_0058152f:
    free(ppvVar2);
  }
  free(vFramePPs);
  iVar1 = vFrameCis->nSize;
  ppvVar2 = vFrameCis->pArray;
  if ((long)iVar1 < 1) {
    if (ppvVar2 == (void **)0x0) goto LAB_00581586;
  }
  else {
    lVar5 = 0;
    do {
      pvVar3 = ppvVar2[lVar5];
      if (pvVar3 != (void *)0x0) {
        if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar3 + 8));
        }
        free(pvVar3);
      }
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  free(ppvVar2);
LAB_00581586:
  free(vFrameCis);
  return pVVar4;
}

Assistant:

Vec_Vec_t * Saig_ManCexMinComputeReason( Aig_Man_t * pAig, Abc_Cex_t * pCex, int fPiReason )
{
    Vec_Vec_t * vFrameCis, * vFramePPs, * vFrameReas;
    // sanity checks
    assert( pCex->nPis == Saig_ManPiNum(pAig) );
    assert( pCex->nRegs == Saig_ManRegNum(pAig) );
    assert( pCex->iPo >= 0 && pCex->iPo < Saig_ManPoNum(pAig) );
    // derive frame terms
    vFrameCis = Saig_ManCexMinCollectFrameTerms( pAig, pCex );
    // derive phase and priority
    vFramePPs = Saig_ManCexMinCollectPhasePriority( pAig, pCex, vFrameCis );
    // derive reasons for property failure
    vFrameReas = Saig_ManCexMinCollectReason( pAig, pCex, vFrameCis, vFramePPs, fPiReason );
    Vec_VecFree( vFramePPs );
    Vec_VecFree( vFrameCis );
    return vFrameReas;
}